

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::MultipleDriverVisitor::share_root(IRNode *node1,IRNode *node2)

{
  size_t *this;
  int iVar1;
  IRNodeKind IVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  IRNode *this_00;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  bool bVar4;
  pair<std::_Rb_tree_const_iterator<kratos::IRNode_*>,_bool> pVar5;
  insert_iterator<std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>_>
  __result;
  undefined1 local_d8 [8];
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> diff;
  undefined1 local_78 [8];
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> nodes2;
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> nodes1;
  IRNode *node2_local;
  IRNode *node1_local;
  
  nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)node2;
  node2_local = node1;
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)&nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)local_78);
  while( true ) {
    iVar1 = (*node2_local->_vptr_IRNode[4])();
    bVar4 = false;
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*node2_local->_vptr_IRNode[4])();
      IVar2 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_00,iVar1));
      bVar4 = IVar2 == StmtKind;
    }
    if (!bVar4) break;
    std::set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>::
    emplace<kratos::IRNode*&>
              ((set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>> *)
               &nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count,&node2_local);
    iVar1 = (*node2_local->_vptr_IRNode[4])();
    node2_local = (IRNode *)CONCAT44(extraout_var_01,iVar1);
  }
  while( true ) {
    lVar3 = (**(code **)(*(long *)nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20))()
    ;
    bVar4 = false;
    if (lVar3 != 0) {
      this_00 = (IRNode *)
                (**(code **)(*(long *)nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20
                            ))();
      IVar2 = IRNode::ir_node_kind(this_00);
      bVar4 = IVar2 == StmtKind;
    }
    if (!bVar4) break;
    pVar5 = std::set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>::
            emplace<kratos::IRNode*&>
                      ((set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                        *)local_78,
                       (IRNode **)&nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    diff._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar5.first._M_node;
    nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (**(code **)(*(long *)nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20))();
  }
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)local_d8);
  this = &nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first1 = std::
             set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::
             begin((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                    *)this);
  __last1 = std::
            set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::
            end((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                 *)this);
  __first2 = std::
             set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::
             begin((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                    *)local_78);
  __last2 = std::
            set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::
            end((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                 *)local_78);
  __i = std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::
        begin((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
               *)local_d8);
  __result = std::
             inserter<std::set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>>
                       ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                         *)local_d8,__i);
  std::
  set_intersection<std::_Rb_tree_const_iterator<kratos::IRNode*>,std::_Rb_tree_const_iterator<kratos::IRNode*>,std::insert_iterator<std::set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>>>
            ((_Rb_tree_const_iterator<kratos::IRNode_*>)__first1._M_node,
             (_Rb_tree_const_iterator<kratos::IRNode_*>)__last1._M_node,
             (_Rb_tree_const_iterator<kratos::IRNode_*>)__first2._M_node,
             (_Rb_tree_const_iterator<kratos::IRNode_*>)__last2._M_node,__result);
  bVar4 = std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
          ::empty((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                   *)local_d8);
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::~set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)local_d8);
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::~set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)local_78);
  std::set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>::~set
            ((set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
              *)&nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (bool)((bVar4 ^ 0xffU) & 1);
}

Assistant:

static bool share_root(IRNode* node1, IRNode* node2) {
        std::set<IRNode*> nodes1;
        std::set<IRNode*> nodes2;
        while (node1->parent() && node1->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            nodes1.emplace(node1);
            node1 = node1->parent();
        }
        while (node2->parent() && node2->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            nodes2.emplace(node2);
            node2 = node2->parent();
        }
        std::set<IRNode*> diff;
        std::set_intersection(nodes1.begin(), nodes1.end(), nodes2.begin(), nodes2.end(),
                              std::inserter(diff, diff.begin()));
        return !diff.empty();
    }